

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::DecRefN(RefcountedTemplate *this,int n)

{
  int iVar1;
  
  Mutex::Lock(&this->mutex_);
  iVar1 = this->refcount_;
  if (iVar1 < n) {
    __assert_fail("refcount_ >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                  ,0x66,"void ctemplate::TemplateCache::RefcountedTemplate::DecRefN(int)");
  }
  this->refcount_ = iVar1 - n;
  Mutex::Unlock(&this->mutex_);
  if (iVar1 == n) {
    ~RefcountedTemplate(this);
    operator_delete(this);
    return;
  }
  return;
}

Assistant:

void DecRefN(int n) {
    bool refcount_is_zero;
    {
      MutexLock ml(&mutex_);
      assert(refcount_ >= n);
      refcount_ -= n;
      refcount_is_zero = (refcount_ == 0);
    }
    // We can't delete this within the MutexLock, because when the
    // MutexLock tries to unlock Mutex at function-exit, the mutex
    // will have been deleted!  This is just as safe as doing the
    // delete within the lock -- in either case, if anyone tried to do
    // anything to this class after the refcount got to 0, bad things
    // would happen.
    if (refcount_is_zero)
      delete this;
  }